

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.h
# Opt level: O2

void __thiscall GF2::WW<4UL>::Set(WW<4UL> *this,size_t pos1,size_t pos2,bool val)

{
  byte bVar1;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  sbyte sVar2;
  
  uVar3 = pos1 >> 6;
  uVar4 = pos2 >> 6;
  if (uVar3 == uVar4) {
    for (; pos1 < pos2; pos1 = pos1 + 1) {
      Set(this,pos1,val);
    }
  }
  else {
    if ((pos1 & 0x3f) != 0) {
      sVar2 = (sbyte)(pos1 & 0x3f);
      bVar1 = -sVar2;
      uVar5 = -1L << sVar2 | this[uVar3]._words[0];
      if (!val) {
        uVar5 = (this[uVar3]._words[0] << (bVar1 & 0x3f)) >> (bVar1 & 0x3f);
      }
      this[uVar3]._words[0] = uVar5;
      uVar3 = uVar3 + 1;
    }
    if ((pos2 & 0x3f) != 0) {
      uVar5 = this[uVar4]._words[0];
      sVar2 = (sbyte)(pos2 & 0x3f);
      this[uVar4]._words[0] = (uVar5 >> sVar2) << sVar2;
      if (val) {
        this[uVar4]._words[0] = uVar5 | 0xffffffffffffffffU >> (-sVar2 & 0x3fU);
      }
    }
    for (; uVar3 < uVar4; uVar3 = uVar3 + 1) {
      this[uVar3]._words[0] = -(ulong)val;
    }
  }
  return;
}

Assistant:

void Set(size_t pos1, size_t pos2, bool val)
	{	
		// номера слов представлений
		size_t wpos1 = pos1 / B_PER_W, wpos2 = pos2 / B_PER_W, pos;
		// в одном слове?
		if (wpos1 == wpos2)
		{
			for (pos = pos1; pos < pos2; Set(pos++, val));
			return;
		}
		// начинаем посередине слова представления?
		if (pos = pos1 % B_PER_W)
		{
			(_words[wpos1] <<= (B_PER_W - pos)) >>= B_PER_W - pos;
			if (val) 
				_words[wpos1] |= WORD_MAX << pos;
			wpos1++;
		}
		// заканчиваем посередине слова представления?
		if (pos = pos2 % B_PER_W)
		{
			(_words[wpos2] >>= pos) <<= pos;
			if (val) 
				_words[wpos2] |= WORD_MAX >> (B_PER_W - pos);
		}
		// заполняем полные слова
		for (pos = wpos1; pos < wpos2; _words[pos++] = (val ? WORD_MAX : 0));
	}